

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt.c
# Opt level: O0

void dropt_set_strncmp(dropt_context *context,dropt_strncmp_func cmp)

{
  dropt_strncmp_func local_18;
  dropt_strncmp_func cmp_local;
  dropt_context *context_local;
  
  if (context == (dropt_context *)0x0) {
    dropt_misuse("No dropt context specified.",
                 "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt.c"
                 ,0x61b);
  }
  else {
    local_18 = cmp;
    if (cmp == (dropt_strncmp_func)0x0) {
      local_18 = strncmp;
    }
    context->ncmpstr = local_18;
    free_lookup_tables(context);
  }
  return;
}

Assistant:

void
dropt_set_strncmp(dropt_context* context, dropt_strncmp_func cmp)
{
    if (context == NULL)
    {
        DROPT_MISUSE("No dropt context specified.");
        return;
    }

    if (cmp == NULL) { cmp = dropt_strncmp; }
    context->ncmpstr = cmp;

    /* Changing the sort method invalidates our existing lookup tables. */
    free_lookup_tables(context);
}